

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_> *node)

{
  long *plVar1;
  long *plVar2;
  long *in_RDX;
  long *local_20;
  long *local_18;
  
  local_18 = *(long **)(*in_RDX + 8);
  *(undefined8 *)(*in_RDX + 8) = 0;
  (*(code *)(node->_M_t).
            super___uniq_ptr_impl<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>.
            _M_t.
            super__Tuple_impl<0UL,_verilogAST::NegEdge_*,_std::default_delete<verilogAST::NegEdge>_>
            .super__Head_base<0UL,_verilogAST::NegEdge_*,_false>._M_head_impl[1].super_Node.
            _vptr_Node)(&local_20);
  plVar2 = local_20;
  local_20 = (long *)0x0;
  plVar1 = *(long **)(*in_RDX + 8);
  *(long **)(*in_RDX + 8) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 0x10))();
    }
  }
  local_20 = (long *)0x0;
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 0x10))();
  }
  this->_vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>,_true,_true>
         )(__uniq_ptr_data<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<NegEdge> Transformer::visit(std::unique_ptr<NegEdge> node) {
  node->value = this->visit(std::move(node->value));
  return node;
}